

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cold_boot_init(cpu_registers *registers)

{
  uint8_t uVar1;
  uint8_t uVar2;
  
  uVar1 = read_RAM(0xfffd);
  uVar2 = read_RAM(0xfffc);
  init_cpu_registers(registers,'\0','\0','\0',CONCAT11(uVar1,uVar2),0xfd,'$');
  return;
}

Assistant:

void cold_boot_init(cpu_registers* registers) {
    const uint8_t initial_A = 0;
    const uint8_t initial_X = 0;
    const uint8_t initial_Y = 0;
    const uint8_t initial_S = 0xFD;
    const uint8_t initial_flags = 0x24;

    //To run NESTEST
    //uint16_t initial_PC = 0xC000;
    uint16_t initial_PC = fetch_reset_vector();
    init_cpu_registers(registers, initial_A, initial_X, initial_Y, initial_PC,
                       initial_S, initial_flags);
}